

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmQtAutoGenInitializer.cxx
# Opt level: O2

void __thiscall
cmQtAutoGenInitializer::cmQtAutoGenInitializer
          (cmQtAutoGenInitializer *this,cmQtAutoGenGlobalInitializer *globalInitializer,
          cmGeneratorTarget *genTarget,IntegerVersion *qtVersion,bool mocEnabled,bool uicEnabled,
          bool rccEnabled,bool globalAutogenTarget,bool globalAutoRccTarget)

{
  uint uVar1;
  cmMakefile *pcVar2;
  cmGeneratorTarget *pcVar3;
  cmTarget *this_00;
  bool bVar4;
  cmGlobalGenerator *pcVar5;
  cmLocalGenerator *pcVar6;
  string *psVar7;
  char *__s;
  allocator<char> local_9a;
  allocator<char> local_99;
  string local_98;
  string local_78;
  anon_struct_696_16_37873454_for_AutogenTarget *local_58;
  anon_struct_248_6_e7572c21_for_Dir *local_50;
  cmFilePathChecksum *local_48;
  cmValue local_40;
  cmValue local_38;
  
  this->GlobalInitializer = globalInitializer;
  this->GenTarget = genTarget;
  pcVar5 = cmGeneratorTarget::GetGlobalGenerator(genTarget);
  this->GlobalGen = pcVar5;
  pcVar6 = cmGeneratorTarget::GetLocalGenerator(genTarget);
  this->LocalGen = pcVar6;
  pcVar2 = genTarget->Makefile;
  this->Makefile = pcVar2;
  local_48 = &this->PathCheckSum;
  cmFilePathChecksum::cmFilePathChecksum(local_48,pcVar2);
  this->QtVersion = *qtVersion;
  this->Verbosity = 0;
  this->MultiConfig = false;
  this->CrossConfig = false;
  this->UseBetterGraph = false;
  this->CMP0071Accept = false;
  this->CMP0071Accept = false;
  this->CMP0071Warn = false;
  this->CMP0100Accept = false;
  this->CMP0100Warn = false;
  (this->ConfigDefault)._M_dataplus._M_p = (pointer)&(this->ConfigDefault).field_2;
  (this->ConfigDefault)._M_string_length = 0;
  (this->ConfigDefault).field_2._M_local_buf[0] = '\0';
  (this->ConfigsList).
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  (this->ConfigsList).
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  (this->ConfigsList).
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  (this->TargetsFolder)._M_dataplus._M_p = (pointer)&(this->TargetsFolder).field_2;
  (this->TargetsFolder)._M_string_length = 0;
  (this->TargetsFolder).field_2._M_local_buf[0] = '\0';
  local_50 = &this->Dir;
  {unnamed_type#1}::cmQtAutoGenInitializer((_unnamed_type_1_ *)local_50);
  local_58 = &this->AutogenTarget;
  {unnamed_type#2}::cmQtAutoGenInitializer((_unnamed_type_2_ *)local_58);
  MocT::MocT(&this->Moc);
  UicT::UicT(&this->Uic);
  RccT::RccT(&this->Rcc);
  (this->AutogenTarget).GlobalTarget = globalAutogenTarget;
  (this->Moc).super_GenVarsT.Enabled = mocEnabled;
  (this->Uic).super_GenVarsT.Enabled = uicEnabled;
  (this->Rcc).super_GenVarsT.Enabled = rccEnabled;
  (this->Rcc).GlobalTarget = globalAutoRccTarget;
  pcVar2 = this->Makefile;
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_98,"CMAKE_CROSS_CONFIGS",(allocator<char> *)&local_78);
  psVar7 = cmMakefile::GetSafeDefinition(pcVar2,&local_98);
  this->CrossConfig = psVar7->_M_string_length != 0;
  std::__cxx11::string::~string((string *)&local_98);
  pcVar3 = this->GenTarget;
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_98,"AUTOGEN_BETTER_GRAPH_MULTI_CONFIG",&local_99);
  local_38 = cmGeneratorTarget::GetProperty(pcVar3,&local_98);
  bVar4 = cmValue::IsSet(&local_38);
  if (bVar4) {
    pcVar3 = this->GenTarget;
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_78,"AUTOGEN_BETTER_GRAPH_MULTI_CONFIG",&local_9a);
    local_40 = cmGeneratorTarget::GetProperty(pcVar3,&local_78);
    bVar4 = cmValue::IsOn(&local_40);
    this->UseBetterGraph = bVar4;
    std::__cxx11::string::~string((string *)&local_78);
  }
  else {
    uVar1 = (this->QtVersion).Major;
    bVar4 = true;
    if (uVar1 < 7) {
      if (uVar1 == 6) {
        bVar4 = 7 < (this->QtVersion).Minor;
      }
      else {
        bVar4 = false;
      }
    }
    this->UseBetterGraph = bVar4;
  }
  std::__cxx11::string::~string((string *)&local_98);
  this_00 = this->GenTarget->Target;
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_98,"AUTOGEN_BETTER_GRAPH_MULTI_CONFIG",(allocator<char> *)&local_38);
  __s = "OFF";
  if (this->UseBetterGraph != false) {
    __s = "ON";
  }
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_78,__s,(allocator<char> *)&local_40);
  cmTarget::SetProperty(this_00,&local_98,&local_78);
  std::__cxx11::string::~string((string *)&local_78);
  std::__cxx11::string::~string((string *)&local_98);
  return;
}

Assistant:

cmQtAutoGenInitializer::cmQtAutoGenInitializer(
  cmQtAutoGenGlobalInitializer* globalInitializer,
  cmGeneratorTarget* genTarget, IntegerVersion const& qtVersion,
  bool mocEnabled, bool uicEnabled, bool rccEnabled, bool globalAutogenTarget,
  bool globalAutoRccTarget)
  : GlobalInitializer(globalInitializer)
  , GenTarget(genTarget)
  , GlobalGen(genTarget->GetGlobalGenerator())
  , LocalGen(genTarget->GetLocalGenerator())
  , Makefile(genTarget->Makefile)
  , PathCheckSum(genTarget->Makefile)
  , QtVersion(qtVersion)
{
  this->AutogenTarget.GlobalTarget = globalAutogenTarget;
  this->Moc.Enabled = mocEnabled;
  this->Uic.Enabled = uicEnabled;
  this->Rcc.Enabled = rccEnabled;
  this->Rcc.GlobalTarget = globalAutoRccTarget;
  this->CrossConfig =
    !this->Makefile->GetSafeDefinition("CMAKE_CROSS_CONFIGS").empty();
  this->UseBetterGraph =
    this->GenTarget->GetProperty("AUTOGEN_BETTER_GRAPH_MULTI_CONFIG").IsSet()
    ? this->GenTarget->GetProperty("AUTOGEN_BETTER_GRAPH_MULTI_CONFIG").IsOn()
    : (this->QtVersion >= IntegerVersion(6, 8));
  // AUTOGEN_BETTER_GRAPH_MULTI_CONFIG is set explicitly because it is read by
  // the qt library
  this->GenTarget->Target->SetProperty("AUTOGEN_BETTER_GRAPH_MULTI_CONFIG",
                                       this->UseBetterGraph ? "ON" : "OFF");
}